

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smb.c
# Opt level: O1

CURLcode smb_send_setup(Curl_easy *data)

{
  uchar *plaintext;
  uint uVar1;
  connectdata *pcVar2;
  CURLcode CVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  ulong uVar8;
  uchar lm [24];
  uchar nt_hash [21];
  uchar lm_hash [21];
  uchar nt [24];
  smb_setup msg;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  uchar local_4b8 [32];
  uchar local_498 [32];
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined2 local_458;
  undefined3 uStack_456;
  undefined4 uStack_453;
  undefined2 uStack_44f;
  undefined2 uStack_44d;
  undefined2 uStack_44b;
  undefined4 uStack_449;
  undefined2 uStack_445;
  undefined8 uStack_443;
  undefined8 local_43b;
  undefined8 uStack_433;
  undefined8 local_42b;
  undefined8 local_423;
  undefined8 uStack_41b;
  undefined8 local_413;
  char local_40b;
  char cStack_40a;
  undefined4 uStack_409;
  undefined2 uStack_405;
  undefined4 uStack_403;
  undefined1 auStack_3ff [975];
  
  pcVar2 = data->conn;
  sVar4 = strlen((char *)(pcVar2->proto).rtspc.buf.leng);
  sVar5 = strlen((char *)(pcVar2->proto).rtspc.buf.allc);
  uVar8 = sVar4 + sVar5 + 0x3d;
  CVar3 = CURLE_FILESIZE_EXCEEDED;
  if (uVar8 < 0x401) {
    Curl_ntlm_core_mk_lm_hash(pcVar2->passwd,local_498);
    plaintext = (pcVar2->proto).smbc.challenge;
    Curl_ntlm_core_lm_resp(local_498,plaintext,(uchar *)&local_4d8);
    Curl_ntlm_core_mk_nt_hash(pcVar2->passwd,local_4b8);
    Curl_ntlm_core_lm_resp(local_4b8,plaintext,(uchar *)&local_478);
    uStack_456 = 0;
    uStack_445 = 0;
    local_458 = 0xff0d;
    uStack_453 = 0x19000;
    uStack_44f = 1;
    uVar1 = (pcVar2->proto).smbc.session_key;
    uStack_44d = (undefined2)uVar1;
    uStack_44b = (undefined2)(uVar1 >> 0x10);
    uStack_443 = 0x80000;
    uStack_449 = 0x180018;
    local_43b = local_4d8;
    uStack_433 = uStack_4d0;
    local_42b = local_4c8;
    local_423 = local_478;
    uStack_41b = uStack_470;
    local_413 = local_468;
    strcpy(&local_40b,(char *)(pcVar2->proto).rtspc.buf.leng);
    sVar6 = strlen((char *)(pcVar2->proto).rtspc.buf.leng);
    strcpy(&cStack_40a + sVar6,(char *)(pcVar2->proto).rtspc.buf.allc);
    sVar7 = strlen((char *)(pcVar2->proto).rtspc.buf.allc);
    *(undefined4 *)((long)&uStack_409 + sVar7 + sVar6) = 0x756e694c;
    *(undefined2 *)((long)&uStack_405 + sVar7 + sVar6) = 0x78;
    *(undefined4 *)(auStack_3ff + sVar7 + sVar6 + -4) = 0x6c727563;
    auStack_3ff[sVar7 + sVar6] = 0;
    uStack_443 = CONCAT26((short)uVar8,(undefined6)uStack_443);
    CVar3 = smb_send_message(data,'s',&local_458,sVar4 + sVar5 + 0x5a);
  }
  return CVar3;
}

Assistant:

static CURLcode smb_send_setup(struct Curl_easy *data)
{
  struct connectdata *conn = data->conn;
  struct smb_conn *smbc = &conn->proto.smbc;
  struct smb_setup msg;
  char *p = msg.bytes;
  unsigned char lm_hash[21];
  unsigned char lm[24];
  unsigned char nt_hash[21];
  unsigned char nt[24];

  const size_t byte_count = sizeof(lm) + sizeof(nt) +
    strlen(smbc->user) + strlen(smbc->domain) +
    strlen(OS) + strlen(CLIENTNAME) + 4; /* 4 null chars */
  if(byte_count > sizeof(msg.bytes))
    return CURLE_FILESIZE_EXCEEDED;

  Curl_ntlm_core_mk_lm_hash(conn->passwd, lm_hash);
  Curl_ntlm_core_lm_resp(lm_hash, smbc->challenge, lm);
  Curl_ntlm_core_mk_nt_hash(conn->passwd, nt_hash);
  Curl_ntlm_core_lm_resp(nt_hash, smbc->challenge, nt);

  memset(&msg, 0, sizeof(msg) - sizeof(msg.bytes));
  msg.word_count = SMB_WC_SETUP_ANDX;
  msg.andx.command = SMB_COM_NO_ANDX_COMMAND;
  msg.max_buffer_size = smb_swap16(MAX_MESSAGE_SIZE);
  msg.max_mpx_count = smb_swap16(1);
  msg.vc_number = smb_swap16(1);
  msg.session_key = smb_swap32(smbc->session_key);
  msg.capabilities = smb_swap32(SMB_CAP_LARGE_FILES);
  msg.lengths[0] = smb_swap16(sizeof(lm));
  msg.lengths[1] = smb_swap16(sizeof(nt));
  memcpy(p, lm, sizeof(lm));
  p += sizeof(lm);
  memcpy(p, nt, sizeof(nt));
  p += sizeof(nt);
  MSGCATNULL(smbc->user);
  MSGCATNULL(smbc->domain);
  MSGCATNULL(OS);
  MSGCATNULL(CLIENTNAME);
  DEBUGASSERT(byte_count == (size_t)(p - msg.bytes));
  msg.byte_count = smb_swap16((unsigned short)byte_count);

  return smb_send_message(data, SMB_COM_SETUP_ANDX, &msg,
                          sizeof(msg) - sizeof(msg.bytes) + byte_count);
}